

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O1

Var Js::TypedArrayBase::EntryFrom(RecyclableObject *function,CallInfo callInfo,...)

{
  Type *alloc;
  ImplicitCallFlags IVar1;
  ScriptContext *pSVar2;
  JavascriptLibrary *pJVar3;
  ThreadContext *pTVar4;
  code *pcVar5;
  RecyclableObject *pRVar6;
  bool bVar7;
  bool bVar8;
  BOOL BVar9;
  uint32 uVar10;
  Attributes AVar11;
  int iVar12;
  undefined4 *puVar13;
  Var pvVar14;
  RecyclableObject *pRVar15;
  RecyclableObject *pRVar16;
  RecyclableObject *nextFunc;
  Type *ppvVar17;
  uint64 uVar18;
  uint64 uVar19;
  JavascriptMethod p_Var20;
  TypedArrayBase *pTVar21;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar22;
  List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *this;
  ulong uVar23;
  uint uVar24;
  TypedArrayBase *pTVar25;
  int in_stack_00000010;
  undefined1 local_120 [8];
  AutoTagNativeLibraryEntry __tag;
  CallInfo local_f0;
  CallInfo callInfo_local;
  anon_class_24_3_1d317480_for_newObjectCreationFunction local_e0;
  undefined1 local_c8 [8];
  ArgumentReader args;
  Var nextValue;
  JavascriptArray *local_98;
  JavascriptArray *local_90;
  RecyclableObject *local_88;
  RecyclableObject *items;
  TypedArrayBase *local_78;
  RecyclableObject *local_70;
  RecyclableObject *local_68;
  undefined4 *local_60;
  TypedArrayBase *local_58;
  RecyclableObject *local_50;
  TypedArrayBase *local_48;
  RecyclableObject *local_40;
  ScriptContext *local_38;
  
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_f0 = callInfo;
  ThreadContext::ProbeStack(pSVar2->threadContext,0xc00,pSVar2,(PVOID)0x0);
  if (in_stack_00000010 != local_f0._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x55a,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar7) goto LAB_00d6ab72;
    *puVar13 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_c8 = (undefined1  [8])local_f0;
  ArgumentReader::AdjustArguments((ArgumentReader *)local_c8,&local_f0);
  local_38 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
             scriptContext.ptr;
  pJVar3 = (local_38->super_ScriptContextBase).javascriptLibrary;
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_120,function,local_f0,L"[TypedArray].from",
             &stack0x00000000);
  if (((ulong)local_f0 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x560,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar7) goto LAB_00d6ab72;
    *puVar13 = 0;
  }
  if (((ulong)local_c8 & 0xffffff) == 0) {
LAB_00d6ab79:
    JavascriptError::ThrowTypeError(local_38,-0x7ff5ec40,L"[TypedArray].from");
  }
  pvVar14 = Arguments::operator[]((Arguments *)local_c8,0);
  bVar7 = JavascriptOperators::IsConstructor(pvVar14);
  if (!bVar7) goto LAB_00d6ab79;
  pvVar14 = Arguments::operator[]((Arguments *)local_c8,0);
  pRVar15 = VarTo<Js::RecyclableObject>(pvVar14);
  bVar7 = JavascriptLibrary::IsTypedArrayConstructor(pRVar15,local_38);
  local_88 = (RecyclableObject *)0x0;
  if (((ulong)local_c8 & 0xfffffe) == 0) {
LAB_00d6ab8e:
    JavascriptError::ThrowTypeError(local_38,-0x7ff5ec36,L"[TypedArray].from");
  }
  pvVar14 = Arguments::operator[]((Arguments *)local_c8,1);
  BVar9 = JavascriptConversion::ToObject(pvVar14,local_38,&local_88);
  if (BVar9 == 0) goto LAB_00d6ab8e;
  callInfo_local._0_4_ = local_c8._0_4_ & 0xffffff;
  callInfo_local._4_4_ = 0;
  local_48 = (TypedArrayBase *)CONCAT71(local_48._1_7_,bVar7);
  if ((ulong)callInfo_local < 3) {
    local_70 = (RecyclableObject *)0x0;
    local_40 = (RecyclableObject *)0x0;
  }
  else {
    pvVar14 = Arguments::operator[]((Arguments *)local_c8,2);
    bVar7 = JavascriptConversion::IsCallable(pvVar14);
    if (!bVar7) {
      JavascriptError::ThrowTypeError(local_38,-0x7ff5ec34,L"[TypedArray].from");
    }
    pvVar14 = Arguments::operator[]((Arguments *)local_c8,2);
    local_40 = VarTo<Js::RecyclableObject>(pvVar14);
    if (((ulong)local_c8 & 0xfffffc) == 0) {
      local_70 = (pJVar3->super_JavascriptLibraryBase).undefinedValue.ptr;
    }
    else {
      local_70 = (RecyclableObject *)Arguments::operator[]((Arguments *)local_c8,3);
    }
  }
  pRVar16 = JavascriptOperators::GetIterator(local_88,local_38,true);
  if (pRVar16 != (RecyclableObject *)0x0) {
    __tag.entry.next = (Entry *)ScriptContext::GetTemporaryGuestAllocator(local_38,L"Runtime");
    alloc = &((TempGuestArenaAllocatorObject *)__tag.entry.next)->allocator;
    items = (RecyclableObject *)new<Memory::ArenaAllocator>(0x30,alloc,0x366bee);
    (items->type).ptr = (Type *)0x0;
    *(undefined4 *)
     &items[1].super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = 0
    ;
    items[1].type.ptr = (Type *)alloc;
    (items->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
         (_func_int **)&PTR_IsReadOnly_014f1568;
    items[2].super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
         (_func_int **)0x400000000;
    nextFunc = JavascriptOperators::CacheIteratorNext(pRVar16,local_38);
    bVar7 = JavascriptOperators::IteratorStepAndValue
                      (pRVar16,local_38,nextFunc,&args.super_Arguments.Values);
    pRVar6 = items;
    if (bVar7) {
      do {
        JsUtil::List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
        EnsureArray((List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                     *)pRVar6,0);
        iVar12 = *(int *)&pRVar6[1].super_FinalizableObject.super_IRecyclerVisitedObject.
                          _vptr_IRecyclerVisitedObject;
        *(Type *)(&((pRVar6->type).ptr)->typeId + (long)iVar12 * 2) = args.super_Arguments.Values;
        *(int *)&pRVar6[1].super_FinalizableObject.super_IRecyclerVisitedObject.
                 _vptr_IRecyclerVisitedObject = iVar12 + 1;
        bVar7 = JavascriptOperators::IteratorStepAndValue
                          (pRVar16,local_38,nextFunc,&args.super_Arguments.Values);
      } while (bVar7);
    }
    local_e0.len = *(uint32 *)
                    &items[1].super_FinalizableObject.super_IRecyclerVisitedObject.
                     _vptr_IRecyclerVisitedObject;
    uVar22 = (ulong)local_e0.len;
    pTVar4 = local_38->threadContext;
    local_e0.scriptContext = local_38;
    if ((char)local_48 == '\0') {
      bVar7 = pTVar4->reentrancySafeOrHandled;
      pTVar4->reentrancySafeOrHandled = true;
      local_e0.constructor = pRVar15;
      args.super_Arguments.Values = (Type)pRVar15;
      AVar11 = FunctionInfo::GetAttributes(pRVar15);
      bVar8 = ThreadContext::HasNoSideEffect(pTVar4,pRVar15,AVar11);
      if (bVar8) {
        pRVar15 = (RecyclableObject *)
                  anon_func::anon_class_24_1_2f014396::
                  anon_class_24_3_1d317480_for_newObjectCreationFunction::operator()
                            ((anon_class_24_3_1d317480_for_newObjectCreationFunction *)
                             &args.super_Arguments.Values);
        bVar8 = ThreadContext::IsOnStack(pRVar15);
        pRVar16 = local_40;
        if (bVar8) {
LAB_00d69f4e:
          pTVar4->implicitCallFlags = pTVar4->implicitCallFlags | ImplicitCall_Accessor;
        }
      }
      else if ((pTVar4->disableImplicitFlags & DisableImplicitCallFlag) == DisableImplicitNoFlag) {
        if ((AVar11 & HasNoSideEffect) == None) {
          IVar1 = pTVar4->implicitCallFlags;
          pRVar15 = (RecyclableObject *)
                    anon_func::anon_class_24_1_2f014396::
                    anon_class_24_3_1d317480_for_newObjectCreationFunction::operator()
                              ((anon_class_24_3_1d317480_for_newObjectCreationFunction *)
                               &args.super_Arguments.Values);
          pTVar4->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
          pRVar16 = local_40;
        }
        else {
          pRVar15 = (RecyclableObject *)
                    anon_func::anon_class_24_1_2f014396::
                    anon_class_24_3_1d317480_for_newObjectCreationFunction::operator()
                              ((anon_class_24_3_1d317480_for_newObjectCreationFunction *)
                               &args.super_Arguments.Values);
          pRVar16 = local_40;
          bVar8 = ThreadContext::IsOnStack(pRVar15);
          if (bVar8) goto LAB_00d69f4e;
        }
      }
      else {
        pTVar4->implicitCallFlags = pTVar4->implicitCallFlags | ImplicitCall_Accessor;
        pRVar15 = (((((((((pRVar15->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase
                      ).scriptContext.ptr)->super_ScriptContextBase).javascriptLibrary)->
                  super_JavascriptLibraryBase).undefinedValue.ptr;
        pRVar16 = local_40;
      }
      pTVar4->reentrancySafeOrHandled = bVar7;
    }
    else {
      bVar7 = pTVar4->reentrancySafeOrHandled;
      pTVar4->reentrancySafeOrHandled = true;
      local_e0.constructor = pRVar15;
      pRVar15 = (RecyclableObject *)
                anon_func::anon_class_24_1_2f014396::
                anon_class_24_3_1d317480_for_newObjectCreationFunction::operator()(&local_e0);
      pTVar4->reentrancySafeOrHandled = bVar7;
      pRVar16 = local_40;
    }
    bVar7 = VarIs<Js::TypedArrayBase>(pRVar15);
    this = (List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)
           items;
    if (bVar7) {
      local_78 = UnsafeVarTo<Js::TypedArrayBase>(pRVar15);
    }
    else {
      local_78 = (TypedArrayBase *)0x0;
    }
    if (local_78 == (TypedArrayBase *)0x0) {
      local_90 = JavascriptArray::TryVarToNonES5Array(pRVar15);
    }
    else {
      local_90 = (JavascriptArray *)0x0;
    }
    if (uVar22 != 0) {
      local_58 = (TypedArrayBase *)__tls_get_addr(&PTR_0155fe48);
      uVar23 = 0;
      local_50 = pRVar15;
      do {
        uVar10 = (uint32)uVar23;
        ppvVar17 = JsUtil::
                   List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                   ::Item(this,uVar10);
        local_48 = (TypedArrayBase *)*ppvVar17;
        if (2 < (uint)callInfo_local._0_4_) {
          if (pRVar16 == (RecyclableObject *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *(undefined4 *)
             &(local_58->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject = 1;
            bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                        ,0x5b4,"(mapFn != nullptr)","mapFn != nullptr");
            if (!bVar7) goto LAB_00d6ab72;
            *(undefined4 *)
             &(local_58->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject = 0;
          }
          if (local_70 == (RecyclableObject *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *(undefined4 *)
             &(local_58->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject = 1;
            bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                        ,0x5b5,"(mapFnThisArg != nullptr)","mapFnThisArg != nullptr"
                                       );
            if (!bVar7) goto LAB_00d6ab72;
            *(undefined4 *)
             &(local_58->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject = 0;
          }
          if ((int)uVar10 < 0) {
            local_68 = (RecyclableObject *)(double)(uVar23 & 0xffffffff);
            uVar18 = NumberUtilities::ToSpecial((double)local_68);
            bVar7 = NumberUtilities::IsNan((double)local_68);
            if (((bVar7) &&
                (uVar19 = NumberUtilities::ToSpecial((double)local_68), uVar19 != 0xfff8000000000000
                )) && (uVar19 = NumberUtilities::ToSpecial((double)local_68),
                      uVar19 != 0x7ff8000000000000)) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *(undefined4 *)
               &(local_58->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject = 1;
              bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                          ,0xa2,
                                          "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                          ,"We should only produce a NaN with this value");
              if (!bVar7) goto LAB_00d6ab72;
              *(undefined4 *)
               &(local_58->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject = 0;
            }
            local_60 = (undefined4 *)(uVar18 ^ 0xfffc000000000000);
          }
          else {
            local_60 = (undefined4 *)(uVar23 + 0x1000000000000);
          }
          pSVar2 = local_38;
          pRVar15 = local_40;
          pTVar4 = local_38->threadContext;
          local_68 = (RecyclableObject *)CONCAT71(local_68._1_7_,pTVar4->reentrancySafeOrHandled);
          pTVar4->reentrancySafeOrHandled = true;
          AVar11 = FunctionInfo::GetAttributes(local_40);
          bVar7 = ThreadContext::HasNoSideEffect(pTVar4,pRVar15,AVar11);
          if (bVar7) {
            ThreadContext::CheckAndResetReentrancySafeOrHandled(pSVar2->threadContext);
            pRVar16 = local_40;
            pRVar15 = local_50;
            if (local_38->threadContext->noJsReentrancy == true) {
              Throw::FatalJsReentrancyError();
            }
            p_Var20 = RecyclableObject::GetEntryPoint(local_40);
            CheckIsExecutable(pRVar16,p_Var20);
            p_Var20 = RecyclableObject::GetEntryPoint(pRVar16);
            local_48 = (TypedArrayBase *)(*p_Var20)(pRVar16,(CallInfo)0x2000003,0);
            bVar7 = ThreadContext::IsOnStack(local_48);
LAB_00d6a3ff:
            if (bVar7 != false) {
              pTVar4->implicitCallFlags = pTVar4->implicitCallFlags | ImplicitCall_Accessor;
            }
          }
          else if ((pTVar4->disableImplicitFlags & DisableImplicitCallFlag) == DisableImplicitNoFlag
                  ) {
            if ((AVar11 & HasNoSideEffect) != None) {
              ThreadContext::CheckAndResetReentrancySafeOrHandled(pSVar2->threadContext);
              pRVar16 = local_40;
              pRVar15 = local_50;
              if (local_38->threadContext->noJsReentrancy == true) {
                Throw::FatalJsReentrancyError();
              }
              p_Var20 = RecyclableObject::GetEntryPoint(local_40);
              CheckIsExecutable(pRVar16,p_Var20);
              p_Var20 = RecyclableObject::GetEntryPoint(pRVar16);
              local_48 = (TypedArrayBase *)
                         (*p_Var20)(pRVar16,(CallInfo)pRVar16,0x2000003,0,0,0,0,0x2000003,local_70,
                                    local_48,local_60);
              bVar7 = ThreadContext::IsOnStack(local_48);
              goto LAB_00d6a3ff;
            }
            IVar1 = pTVar4->implicitCallFlags;
            ThreadContext::CheckAndResetReentrancySafeOrHandled(pSVar2->threadContext);
            pRVar16 = local_40;
            if (pSVar2->threadContext->noJsReentrancy == true) {
              Throw::FatalJsReentrancyError();
            }
            p_Var20 = RecyclableObject::GetEntryPoint(local_40);
            CheckIsExecutable(pRVar16,p_Var20);
            p_Var20 = RecyclableObject::GetEntryPoint(pRVar16);
            local_48 = (TypedArrayBase *)(*p_Var20)(pRVar16,(CallInfo)0x2000003,0);
            pTVar4->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
            pRVar15 = local_50;
          }
          else {
            pTVar4->implicitCallFlags = pTVar4->implicitCallFlags | ImplicitCall_Accessor;
            local_48 = (TypedArrayBase *)
                       (((((((((local_40->type).ptr)->javascriptLibrary).ptr)->
                           super_JavascriptLibraryBase).scriptContext.ptr)->super_ScriptContextBase)
                        .javascriptLibrary)->super_JavascriptLibraryBase).undefinedValue.ptr;
            pRVar15 = local_50;
            pRVar16 = local_40;
          }
          pTVar4->reentrancySafeOrHandled = local_68._0_1_;
          this = (List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  *)items;
        }
        if (local_78 == (TypedArrayBase *)0x0) {
          if (local_90 == (JavascriptArray *)0x0) {
            JavascriptOperators::OP_SetElementI_UInt32
                      (pRVar15,uVar10,local_48,local_38,PropertyOperation_ThrowIfNotExtensible);
          }
          else {
            (*(local_90->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x29])(local_90,uVar23 & 0xffffffff,local_48);
          }
        }
        else {
          (*(local_78->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
            super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x70])(local_78,uVar23 & 0xffffffff,local_48);
        }
        uVar23 = uVar23 + 1;
      } while (uVar22 != uVar23);
    }
    ScriptContext::ReleaseTemporaryGuestAllocator
              (local_38,(TempGuestArenaAllocatorObject *)__tag.entry.next);
    goto LAB_00d6ab0d;
  }
  pvVar14 = JavascriptOperators::OP_GetLength(local_88,local_38);
  if (((ulong)pvVar14 & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)pvVar14 & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar7) goto LAB_00d6ab72;
    *puVar13 = 0;
  }
  if (((ulong)pvVar14 & 0xffff000000000000) == 0x1000000000000) {
    if (((ulong)pvVar14 & 0x1ffff00000000) != 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar7) {
LAB_00d6ab72:
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      *puVar13 = 0;
    }
  }
  else {
    uVar10 = JavascriptConversion::ToUInt32_Full(pvVar14,local_38);
    pvVar14 = (Var)(ulong)uVar10;
  }
  pRVar16 = local_88;
  bVar7 = VarIs<Js::TypedArrayBase,Js::RecyclableObject>(local_88);
  if (bVar7) {
    local_58 = UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>(pRVar16);
  }
  else {
    local_58 = (TypedArrayBase *)0x0;
  }
  if (local_58 == (TypedArrayBase *)0x0) {
    local_98 = JavascriptArray::TryVarToNonES5Array(local_88);
  }
  else {
    local_98 = (JavascriptArray *)0x0;
  }
  pTVar4 = local_38->threadContext;
  uVar24 = (uint)pvVar14;
  local_e0.scriptContext = local_38;
  local_e0.len = uVar24;
  if ((char)local_48 == '\0') {
    bVar7 = pTVar4->reentrancySafeOrHandled;
    pTVar4->reentrancySafeOrHandled = true;
    local_e0.constructor = pRVar15;
    args.super_Arguments.Values = (Type)pRVar15;
    AVar11 = FunctionInfo::GetAttributes(pRVar15);
    bVar8 = ThreadContext::HasNoSideEffect(pTVar4,pRVar15,AVar11);
    if (bVar8) {
      pRVar15 = (RecyclableObject *)
                anon_func::anon_class_24_1_2f014396::
                anon_class_24_3_1d317480_for_newObjectCreationFunction::operator()
                          ((anon_class_24_3_1d317480_for_newObjectCreationFunction *)
                           &args.super_Arguments.Values);
      bVar8 = ThreadContext::IsOnStack(pRVar15);
LAB_00d6a0bc:
      local_50 = pRVar15;
      if (bVar8 != false) {
        pTVar4->implicitCallFlags = pTVar4->implicitCallFlags | ImplicitCall_Accessor;
      }
    }
    else if ((pTVar4->disableImplicitFlags & DisableImplicitCallFlag) == DisableImplicitNoFlag) {
      if ((AVar11 & HasNoSideEffect) != None) {
        pRVar15 = (RecyclableObject *)
                  anon_func::anon_class_24_1_2f014396::
                  anon_class_24_3_1d317480_for_newObjectCreationFunction::operator()
                            ((anon_class_24_3_1d317480_for_newObjectCreationFunction *)
                             &args.super_Arguments.Values);
        bVar8 = ThreadContext::IsOnStack(pRVar15);
        goto LAB_00d6a0bc;
      }
      IVar1 = pTVar4->implicitCallFlags;
      local_50 = (RecyclableObject *)
                 anon_func::anon_class_24_1_2f014396::
                 anon_class_24_3_1d317480_for_newObjectCreationFunction::operator()
                           ((anon_class_24_3_1d317480_for_newObjectCreationFunction *)
                            &args.super_Arguments.Values);
      pTVar4->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
    }
    else {
      pTVar4->implicitCallFlags = pTVar4->implicitCallFlags | ImplicitCall_Accessor;
      local_50 = (((((((((pRVar15->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase)
                     .scriptContext.ptr)->super_ScriptContextBase).javascriptLibrary)->
                 super_JavascriptLibraryBase).undefinedValue.ptr;
    }
    pTVar4->reentrancySafeOrHandled = bVar7;
  }
  else {
    bVar7 = pTVar4->reentrancySafeOrHandled;
    pTVar4->reentrancySafeOrHandled = true;
    local_e0.constructor = pRVar15;
    local_50 = (RecyclableObject *)
               anon_func::anon_class_24_1_2f014396::
               anon_class_24_3_1d317480_for_newObjectCreationFunction::operator()(&local_e0);
    pTVar4->reentrancySafeOrHandled = bVar7;
  }
  bVar7 = VarIs<Js::TypedArrayBase>(local_50);
  pTVar25 = local_58;
  if (bVar7) {
    pTVar21 = UnsafeVarTo<Js::TypedArrayBase>(local_50);
  }
  else {
    pTVar21 = (TypedArrayBase *)0x0;
  }
  if (pTVar21 == (TypedArrayBase *)0x0) {
    local_90 = JavascriptArray::TryVarToNonES5Array(local_50);
  }
  else {
    local_90 = (JavascriptArray *)0x0;
  }
  pRVar15 = local_50;
  if (uVar24 != 0) {
    local_48 = pTVar21;
    local_60 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    items = (RecyclableObject *)((ulong)pvVar14 & 0xffffffff);
    pRVar16 = (RecyclableObject *)0x0;
    do {
      uVar10 = (uint32)pRVar16;
      if (pTVar25 == (TypedArrayBase *)0x0) {
        if (local_98 == (JavascriptArray *)0x0) {
          pRVar15 = (RecyclableObject *)
                    JavascriptOperators::OP_GetElementI_UInt32(local_88,uVar10,local_38);
        }
        else {
          iVar12 = (*(local_98->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                     super_FinalizableObject.super_IRecyclerVisitedObject.
                     _vptr_IRecyclerVisitedObject[0x72])(local_98,(ulong)pRVar16 & 0xffffffff);
          pRVar15 = (RecyclableObject *)CONCAT44(extraout_var_00,iVar12);
        }
      }
      else {
        iVar12 = (*(pTVar25->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                   super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                   _vptr_IRecyclerVisitedObject[0x72])(pTVar25,(ulong)pRVar16 & 0xffffffff);
        pRVar15 = (RecyclableObject *)CONCAT44(extraout_var,iVar12);
      }
      if (2 < (uint)callInfo_local._0_4_) {
        if (local_40 == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *local_60 = 1;
          bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                      ,0x5ff,"(mapFn != nullptr)","mapFn != nullptr");
          if (!bVar7) goto LAB_00d6ab72;
          *local_60 = 0;
        }
        if (local_70 == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *local_60 = 1;
          bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                      ,0x600,"(mapFnThisArg != nullptr)","mapFnThisArg != nullptr");
          if (!bVar7) goto LAB_00d6ab72;
          *local_60 = 0;
        }
        if ((int)uVar10 < 0) {
          local_78 = (TypedArrayBase *)(double)((ulong)pRVar16 & 0xffffffff);
          uVar18 = NumberUtilities::ToSpecial((double)local_78);
          bVar7 = NumberUtilities::IsNan((double)local_78);
          if (((bVar7) &&
              (uVar19 = NumberUtilities::ToSpecial((double)local_78), uVar19 != 0xfff8000000000000))
             && (uVar19 = NumberUtilities::ToSpecial((double)local_78), uVar19 != 0x7ff8000000000000
                )) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *local_60 = 1;
            bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                        ,0xa2,
                                        "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                        ,"We should only produce a NaN with this value");
            if (!bVar7) goto LAB_00d6ab72;
            *local_60 = 0;
          }
          local_68 = (RecyclableObject *)(uVar18 ^ 0xfffc000000000000);
        }
        else {
          local_68 = pRVar16 + 0x100000000000;
        }
        pRVar6 = local_40;
        pTVar4 = local_38->threadContext;
        local_78 = (TypedArrayBase *)CONCAT71(local_78._1_7_,pTVar4->reentrancySafeOrHandled);
        pTVar4->reentrancySafeOrHandled = true;
        AVar11 = FunctionInfo::GetAttributes(local_40);
        bVar7 = ThreadContext::HasNoSideEffect(pTVar4,pRVar6,AVar11);
        pTVar25 = local_58;
        if (bVar7) {
          ThreadContext::CheckAndResetReentrancySafeOrHandled(local_38->threadContext);
          pTVar25 = local_58;
          if (local_38->threadContext->noJsReentrancy == true) {
            Throw::FatalJsReentrancyError();
          }
          p_Var20 = RecyclableObject::GetEntryPoint(local_40);
          CheckIsExecutable(local_40,p_Var20);
          p_Var20 = RecyclableObject::GetEntryPoint(local_40);
          pRVar15 = (RecyclableObject *)(*p_Var20)(local_40,(CallInfo)0x2000003,0);
          bVar7 = ThreadContext::IsOnStack(pRVar15);
LAB_00d6a921:
          if (bVar7 != false) {
            pTVar4->implicitCallFlags = pTVar4->implicitCallFlags | ImplicitCall_Accessor;
          }
        }
        else if ((pTVar4->disableImplicitFlags & DisableImplicitCallFlag) == DisableImplicitNoFlag)
        {
          if ((AVar11 & HasNoSideEffect) != None) {
            ThreadContext::CheckAndResetReentrancySafeOrHandled(local_38->threadContext);
            if (local_38->threadContext->noJsReentrancy == true) {
              Throw::FatalJsReentrancyError();
            }
            p_Var20 = RecyclableObject::GetEntryPoint(local_40);
            CheckIsExecutable(local_40,p_Var20);
            p_Var20 = RecyclableObject::GetEntryPoint(local_40);
            pRVar15 = (RecyclableObject *)
                      (*p_Var20)(local_40,(CallInfo)local_40,0x2000003,0,0,0,0,0x2000003,local_70,
                                 pRVar15,local_68);
            bVar7 = ThreadContext::IsOnStack(pRVar15);
            goto LAB_00d6a921;
          }
          IVar1 = pTVar4->implicitCallFlags;
          ThreadContext::CheckAndResetReentrancySafeOrHandled(local_38->threadContext);
          pRVar15 = local_40;
          if (local_38->threadContext->noJsReentrancy == true) {
            Throw::FatalJsReentrancyError();
          }
          p_Var20 = RecyclableObject::GetEntryPoint(local_40);
          CheckIsExecutable(pRVar15,p_Var20);
          p_Var20 = RecyclableObject::GetEntryPoint(pRVar15);
          pRVar15 = (RecyclableObject *)(*p_Var20)(pRVar15,(CallInfo)0x2000003,0);
          pTVar4->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
          pTVar25 = local_58;
        }
        else {
          pTVar4->implicitCallFlags = pTVar4->implicitCallFlags | ImplicitCall_Accessor;
          pRVar15 = (((((((((local_40->type).ptr)->javascriptLibrary).ptr)->
                        super_JavascriptLibraryBase).scriptContext.ptr)->super_ScriptContextBase).
                     javascriptLibrary)->super_JavascriptLibraryBase).undefinedValue.ptr;
        }
        pTVar4->reentrancySafeOrHandled = local_78._0_1_;
      }
      if (local_48 == (TypedArrayBase *)0x0) {
        if (local_90 == (JavascriptArray *)0x0) {
          JavascriptOperators::OP_SetElementI_UInt32
                    (local_50,uVar10,pRVar15,local_38,PropertyOperation_ThrowIfNotExtensible);
        }
        else {
          (*(local_90->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                    (local_90,(ulong)pRVar16 & 0xffffffff,pRVar15);
        }
      }
      else {
        (*(local_48->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
          super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
          _vptr_IRecyclerVisitedObject[0x70])(local_48,(ulong)pRVar16 & 0xffffffff,pRVar15);
      }
      pRVar16 = (RecyclableObject *)
                ((long)&(pRVar16->super_FinalizableObject).super_IRecyclerVisitedObject.
                        _vptr_IRecyclerVisitedObject + 1);
      pRVar15 = local_50;
    } while (items != pRVar16);
  }
LAB_00d6ab0d:
  AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry((AutoTagNativeLibraryEntry *)local_120);
  return pRVar15;
}

Assistant:

Var TypedArrayBase::EntryFrom(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        JavascriptLibrary* library = scriptContext->GetLibrary();

        AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, _u("[TypedArray].from"));

        Assert(!(callInfo.Flags & CallFlags_New));
        CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(TypedArray_Prototype_from);

        if (args.Info.Count < 1 || !JavascriptOperators::IsConstructor(args[0]))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedFunction, _u("[TypedArray].from"));
        }

        RecyclableObject* constructor = VarTo<RecyclableObject>(args[0]);
        bool isDefaultConstructor = JavascriptLibrary::IsTypedArrayConstructor(constructor, scriptContext);
        RecyclableObject* items = nullptr;

        if (args.Info.Count < 2 || !JavascriptConversion::ToObject(args[1], scriptContext, &items))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedObject, _u("[TypedArray].from"));
        }

        bool mapping = false;
        RecyclableObject* mapFn = nullptr;
        Var mapFnThisArg = nullptr;

        if (args.Info.Count >= 3)
        {
            if (!JavascriptConversion::IsCallable(args[2]))
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("[TypedArray].from"));
            }

            mapFn = VarTo<RecyclableObject>(args[2]);

            if (args.Info.Count >= 4)
            {
                mapFnThisArg = args[3];
            }
            else
            {
                mapFnThisArg = library->GetUndefined();
            }

            mapping = true;
        }

        Var newObj;
        RecyclableObject* iterator = JavascriptOperators::GetIterator(items, scriptContext, true /* optional */);

        if (iterator != nullptr)
        {
            DECLARE_TEMP_GUEST_ALLOCATOR(tempAlloc);

            ACQUIRE_TEMP_GUEST_ALLOCATOR(tempAlloc, scriptContext, _u("Runtime"));
            {
                // Create a temporary list to hold the items returned from the iterator.
                // We will then iterate over this list and append those items into the object we will return.
                // We have to collect the items into this temporary list because we need to call the
                // new object constructor with a length of items and we don't know what length will be
                // until we iterate across all the items.
                // Consider: Could be possible to fast-path this in order to avoid creating the temporary list
                //       for types we know such as TypedArray. We know the length of a TypedArray but we still
                //       have to be careful in case there is a proxy which could return anything from [[Get]]
                //       or the built-in @@iterator has been replaced.
                JsUtil::List<Var, ArenaAllocator>* tempList = IteratorToList(iterator, scriptContext, tempAlloc);

                uint32 len = tempList->Count();
                newObj = JavascriptOperators::NewObjectCreationHelper_ReentrancySafe(constructor, isDefaultConstructor, scriptContext->GetThreadContext(), [=]()->Js::Var
                {
                    Js::Var constructorArgs[] = { constructor, JavascriptNumber::ToVar(len, scriptContext) };
                    Js::CallInfo constructorCallInfo(Js::CallFlags_New, _countof(constructorArgs));
                    return TypedArrayCreate(constructor, &Js::Arguments(constructorCallInfo, constructorArgs), len, scriptContext);
                });

                TypedArrayBase* newTypedArrayBase = JavascriptOperators::TryFromVar<Js::TypedArrayBase>(newObj);
                JavascriptArray* newArr = nullptr;

                if (!newTypedArrayBase)
                {
                    newArr = JavascriptArray::TryVarToNonES5Array(newObj);
                }

                for (uint32 k = 0; k < len; k++)
                {
                    Var kValue = tempList->Item(k);

                    if (mapping)
                    {
                        Assert(mapFn != nullptr);
                        Assert(mapFnThisArg != nullptr);

                        Var kVar = JavascriptNumber::ToVar(k, scriptContext);
                        kValue = scriptContext->GetThreadContext()->ExecuteImplicitCall(mapFn, Js::ImplicitCall_Accessor, [=]()->Js::Var
                        {
                            return CALL_FUNCTION(scriptContext->GetThreadContext(), mapFn, CallInfo(CallFlags_Value, 3), mapFnThisArg, kValue, kVar);
                        });
                    }

                    // We're likely to have constructed a new TypedArray, but the constructor could return any object
                    if (newTypedArrayBase)
                    {
                        newTypedArrayBase->DirectSetItem(k, kValue);
                    }
                    else if (newArr)
                    {
                        newArr->SetItem(k, kValue, Js::PropertyOperation_ThrowIfNotExtensible);
                    }
                    else
                    {
                        JavascriptOperators::OP_SetElementI_UInt32(newObj, k, kValue, scriptContext, Js::PropertyOperation_ThrowIfNotExtensible);
                    }
                }
            }
            RELEASE_TEMP_GUEST_ALLOCATOR(tempAlloc, scriptContext);
        }
        else
        {
            Var lenValue = JavascriptOperators::OP_GetLength(items, scriptContext);
            uint32 len = JavascriptConversion::ToUInt32(lenValue, scriptContext);

            TypedArrayBase* itemsTypedArrayBase = JavascriptOperators::TryFromVar<Js::TypedArrayBase>(items);
            JavascriptArray* itemsArray = nullptr;

            if (!itemsTypedArrayBase)
            {
                itemsArray = JavascriptArray::TryVarToNonES5Array(items);
            }

            newObj = JavascriptOperators::NewObjectCreationHelper_ReentrancySafe(constructor, isDefaultConstructor, scriptContext->GetThreadContext(), [=]()->Js::Var
            {
                Js::Var constructorArgs[] = { constructor, JavascriptNumber::ToVar(len, scriptContext) };
                Js::CallInfo constructorCallInfo(Js::CallFlags_New, _countof(constructorArgs));
                return TypedArrayBase::TypedArrayCreate(constructor, &Js::Arguments(constructorCallInfo, constructorArgs), len, scriptContext);
            });

            TypedArrayBase* newTypedArrayBase = JavascriptOperators::TryFromVar<Js::TypedArrayBase>(newObj);
            JavascriptArray* newArr = nullptr;

            if (!newTypedArrayBase)
            {
                newArr = JavascriptArray::TryVarToNonES5Array(newObj);
            }

            for (uint32 k = 0; k < len; k++)
            {
                Var kValue;

                // The items source could be anything, but we already know if it's a TypedArray or Array
                if (itemsTypedArrayBase)
                {
                    kValue = itemsTypedArrayBase->DirectGetItem(k);
                }
                else if (itemsArray)
                {
                    kValue = itemsArray->DirectGetItem(k);
                }
                else
                {
                    kValue = JavascriptOperators::OP_GetElementI_UInt32(items, k, scriptContext);
                }

                if (mapping)
                {
                    Assert(mapFn != nullptr);
                    Assert(mapFnThisArg != nullptr);

                    Var kVar = JavascriptNumber::ToVar(k, scriptContext);
                    kValue = scriptContext->GetThreadContext()->ExecuteImplicitCall(mapFn, Js::ImplicitCall_Accessor, [=]()->Js::Var
                    {
                        return CALL_FUNCTION(scriptContext->GetThreadContext(), mapFn, CallInfo(CallFlags_Value, 3), mapFnThisArg, kValue, kVar);
                    });
                }

                // If constructor built a TypedArray (likely) or Array (maybe likely) we can do a more direct set operation
                if (newTypedArrayBase)
                {
                    newTypedArrayBase->DirectSetItem(k, kValue);
                }
                else if (newArr)
                {
                    newArr->SetItem(k, kValue, Js::PropertyOperation_ThrowIfNotExtensible);
                }
                else
                {
                    JavascriptOperators::OP_SetElementI_UInt32(newObj, k, kValue, scriptContext, Js::PropertyOperation_ThrowIfNotExtensible);
                }
            }
        }

        return newObj;
    }